

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_spectrum.cc
# Opt level: O3

bool __thiscall
sptk::FilterCoefficientsToSpectrum::Run
          (FilterCoefficientsToSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *spectrum,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  pointer pdVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  if (this->is_valid_ == true) {
    iVar1 = this->num_numerator_order_;
    lVar18 = (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    lVar15 = lVar18 >> 3;
    if (((lVar15 == (long)iVar1 + 1) && (buffer != (Buffer *)0x0)) &&
       (spectrum != (vector<double,_std::allocator<double>_> *)0x0)) {
      iVar2 = this->num_denominator_order_;
      lVar16 = (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar16 >> 3 == (long)iVar2 + 1) {
        iVar3 = this->fft_length_;
        iVar9 = iVar3 / 2;
        uVar10 = iVar9 + 1;
        uVar14 = (ulong)(int)uVar10;
        iVar11 = iVar3;
        if ((long)(spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != uVar14) {
          std::vector<double,_std::allocator<double>_>::resize(spectrum,uVar14);
          iVar11 = this->fft_length_;
        }
        this_00 = &buffer->fast_fourier_transform_input_;
        if ((ulong)((long)(buffer->fast_fourier_transform_input_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->fast_fourier_transform_input_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < (ulong)(long)iVar11) {
          std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar11);
        }
        this_01 = &buffer->numerator_of_transfer_function_;
        if ((ulong)((long)(buffer->numerator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->numerator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < uVar14) {
          std::vector<double,_std::allocator<double>_>::resize(this_01,uVar14);
        }
        this_02 = &buffer->denominator_of_transfer_function_;
        if ((ulong)((long)(buffer->denominator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(buffer->denominator_of_transfer_function_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) < uVar14) {
          std::vector<double,_std::allocator<double>_>::resize(this_02,uVar14);
        }
        if (iVar1 != 0) {
          pdVar4 = (numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar17 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          sVar12 = (long)(numerator_coefficients->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar4;
          if (sVar12 != 0) {
            memmove(pdVar17,pdVar4,sVar12);
            pdVar17 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          }
          pdVar4 = (buffer->fast_fourier_transform_input_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar17 + lVar15 != pdVar4) {
            memset(pdVar17 + lVar15,0,
                   ((long)pdVar4 + (-8 - (lVar18 + (long)pdVar17)) & 0xfffffffffffffff8U) + 8);
          }
          bVar8 = RealValuedFastFourierTransform::Run
                            (&this->fast_fourier_transform_,this_00,
                             &buffer->fast_fourier_transform_real_output_,
                             &buffer->fast_fourier_transform_imaginary_output_,
                             &buffer->fast_fourier_transform_buffer_);
          if (!bVar8) {
            return false;
          }
          if (-2 < iVar3) {
            pdVar4 = (buffer->fast_fourier_transform_real_output_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar17 = (buffer->fast_fourier_transform_imaginary_output_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar5 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = 0;
            do {
              dVar20 = pdVar4[uVar14];
              dVar19 = pdVar17[uVar14];
              pdVar5[uVar14] = dVar20 * dVar20 + dVar19 * dVar19;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
        }
        if (iVar2 != 0) {
          pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *pdVar4 = 1.0;
          pdVar17 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1;
          sVar12 = (long)(denominator_coefficients->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar17;
          if (sVar12 != 0) {
            memmove(pdVar4 + 1,pdVar17,sVar12);
          }
          pdVar4 = (buffer->fast_fourier_transform_input_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar17 = (pointer)(lVar16 + (long)(buffer->fast_fourier_transform_input_).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start);
          if (pdVar17 != pdVar4) {
            memset(pdVar17,0,((long)pdVar4 + (-8 - (long)pdVar17) & 0xfffffffffffffff8U) + 8);
          }
          bVar8 = RealValuedFastFourierTransform::Run
                            (&this->fast_fourier_transform_,this_00,
                             &buffer->fast_fourier_transform_real_output_,
                             &buffer->fast_fourier_transform_imaginary_output_,
                             &buffer->fast_fourier_transform_buffer_);
          if (!bVar8) {
            return false;
          }
          if (-2 < iVar3) {
            pdVar4 = (buffer->fast_fourier_transform_real_output_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar17 = (buffer->fast_fourier_transform_imaginary_output_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar5 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = 0;
            do {
              dVar20 = pdVar4[uVar14];
              dVar19 = pdVar17[uVar14];
              dVar20 = dVar20 * dVar20 + dVar19 * dVar19;
              pdVar5[uVar14] = dVar20;
              if ((dVar20 == 0.0) && (!NAN(dVar20))) {
                return false;
              }
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
        }
        auVar7 = _DAT_00110070;
        auVar6 = _DAT_00110060;
        dVar20 = *(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        dVar20 = dVar20 * dVar20;
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          if (iVar1 == 0 && iVar2 == 0) {
            pdVar4 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar17 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            if (pdVar4 != pdVar17) {
              dVar19 = *(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              dVar19 = dVar20 * dVar19 * dVar19;
              uVar14 = (long)pdVar17 + (-8 - (long)pdVar4);
              auVar23._8_4_ = (int)uVar14;
              auVar23._0_8_ = uVar14;
              auVar23._12_4_ = (int)(uVar14 >> 0x20);
              auVar21._0_8_ = uVar14 >> 3;
              auVar21._8_8_ = auVar23._8_8_ >> 3;
              uVar13 = 0;
              auVar21 = auVar21 ^ _DAT_00110070;
              do {
                auVar22._8_4_ = (int)uVar13;
                auVar22._0_8_ = uVar13;
                auVar22._12_4_ = (int)(uVar13 >> 0x20);
                auVar23 = (auVar22 | auVar6) ^ auVar7;
                if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                            auVar21._4_4_ < auVar23._4_4_) & 1)) {
                  pdVar4[uVar13] = dVar19;
                }
                if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
                    auVar23._12_4_ <= auVar21._12_4_) {
                  pdVar4[uVar13 + 1] = dVar19;
                }
                uVar13 = uVar13 + 2;
              } while (((uVar14 >> 3) + 2 & 0xfffffffffffffffe) != uVar13);
            }
          }
          else if (iVar2 == 0 || iVar1 != 0) {
            pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (iVar1 == 0 || iVar2 != 0) {
              if (uVar10 != 0) {
                pdVar17 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar5 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                lVar15 = 0;
                do {
                  *(double *)((long)pdVar17 + lVar15) =
                       (*(double *)((long)pdVar4 + lVar15) * dVar20) /
                       *(double *)((long)pdVar5 + lVar15);
                  lVar15 = lVar15 + 8;
                } while ((long)iVar9 * 8 + 8 != lVar15);
              }
            }
            else if (uVar10 != 0) {
              pdVar17 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar15 = 0;
              do {
                *(double *)((long)pdVar17 + lVar15) = *(double *)((long)pdVar4 + lVar15) * dVar20;
                lVar15 = lVar15 + 8;
              } while ((long)iVar9 * 8 + 8 != lVar15);
            }
          }
          else if (uVar10 != 0) {
            dVar19 = *(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar17 = (spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar15 = 0;
            do {
              *(double *)((long)pdVar17 + lVar15) =
                   (dVar20 * dVar19 * dVar19) / *(double *)((long)pdVar4 + lVar15);
              lVar15 = lVar15 + 8;
            } while ((long)iVar9 * 8 + 8 != lVar15);
          }
          bVar8 = SpectrumToSpectrum::Run(&this->spectrum_to_spectrum_,spectrum);
          return bVar8;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* spectrum,
    FilterCoefficientsToSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (spectrum->size() != static_cast<std::size_t>(output_length)) {
    spectrum->resize(output_length);
  }
  if (buffer->fast_fourier_transform_input_.size() <
      static_cast<std::size_t>(fft_length_)) {
    buffer->fast_fourier_transform_input_.resize(fft_length_);
  }
  if (buffer->numerator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->numerator_of_transfer_function_.resize(output_length);
  }
  if (buffer->denominator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->denominator_of_transfer_function_.resize(output_length);
  }

  // Calculate numerators of transfer function.
  if (1 != numerator_length) {
    std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin());
    std::fill(buffer->fast_fourier_transform_input_.begin() + numerator_length,
              buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* xr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* xi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* x(&buffer->numerator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      x[i] = xr[i] * xr[i] + xi[i] * xi[i];
    }
  }

  // Calculate denominators of transfer function.
  if (1 != denominator_length) {
    buffer->fast_fourier_transform_input_[0] = 1.0;
    std::copy(denominator_coefficients.begin() + 1,
              denominator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin() + 1);
    std::fill(
        buffer->fast_fourier_transform_input_.begin() + denominator_length,
        buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* yr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* yi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* y(&buffer->denominator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      y[i] = yr[i] * yr[i] + yi[i] * yi[i];
      if (0.0 == y[i]) {
        return false;
      }
    }
  }

  // Get gain of transfer function.
  const double gain(denominator_coefficients[0] * denominator_coefficients[0]);
  if (0.0 == gain) {
    return false;
  }

  // Calculate power spectrum.
  if (1 == numerator_length && 1 == denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::fill(spectrum->begin(), spectrum->end(), tmp);
  } else if (1 == numerator_length && 1 != denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::transform(
        buffer->denominator_of_transfer_function_.begin(),
        buffer->denominator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [tmp](double y) { return tmp / y; });
  } else if (1 != numerator_length && 1 == denominator_length) {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [gain](double x) { return gain * x; });
  } else {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        buffer->denominator_of_transfer_function_.begin(), spectrum->begin(),
        [gain](double x, double y) { return gain * x / y; });
  }

  if (!spectrum_to_spectrum_.Run(spectrum)) {
    return false;
  }

  return true;
}